

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumVal.cpp
# Opt level: O2

int main(int argC,char **argV)

{
  char *pcVar1;
  char cVar2;
  DTDValidator *this;
  SAXParser *this_00;
  ostream *poVar3;
  long lVar4;
  DTDElementDecl *this_01;
  XMLCh *pXVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  int iVar9;
  uint uVar10;
  StrX local_68;
  int local_5c;
  NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> elemEnum;
  
  uVar7 = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (((argC < 2) || (argC != 2)) || (pcVar1 = argV[1], *pcVar1 == '-')) {
    usage();
    xercesc_4_0::XMLPlatformUtils::Terminate();
    iVar9 = 1;
  }
  else {
    this = (DTDValidator *)xercesc_4_0::XMemory::operator_new((XMemory *)0x30,uVar7);
    uVar7 = 0;
    xercesc_4_0::DTDValidator::DTDValidator(this,(XMLErrorReporter *)0x0);
    this_00 = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,uVar7);
    xercesc_4_0::SAXParser::SAXParser
              (this_00,(XMLValidator *)this,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
               (XMLGrammarPool *)0x0);
    xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this_00);
    (**(code **)(*(long *)this_00 + 0x40))(this_00,pcVar1);
    local_5c = xercesc_4_0::SAXParser::getErrorCount();
    if (local_5c == 0) {
      lVar4 = (**(code **)(*(long *)this + 0x50))(this);
      elemEnum.fMemoryManager = *(MemoryManager **)(lVar4 + 8);
      elemEnum.fToEnum = *(NameIdPool<xercesc_4_0::DTDElementDecl> **)(lVar4 + 0x10);
      elemEnum.super_XMLEnumerator<xercesc_4_0::DTDElementDecl>._vptr_XMLEnumerator =
           (_func_int **)&PTR__XMLEnumerator_00104cb8;
      uVar7 = *(ulong *)(elemEnum.fToEnum + 0x18);
      elemEnum.fCurIndex = (XMLSize_t)(uVar7 != 0);
      if (uVar7 < elemEnum.fCurIndex || uVar7 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"The validator has no elements to display\n")
        ;
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        std::operator<<((ostream *)&std::cout,"\nELEMENTS:\n----------------------------\n");
        while ((elemEnum.fCurIndex != 0 &&
               (elemEnum.fCurIndex <= *(ulong *)(elemEnum.fToEnum + 0x18)))) {
          this_01 = xercesc_4_0::NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::nextElement
                              (&elemEnum);
          poVar3 = std::operator<<((ostream *)&std::cout,"  Name: ");
          pXVar5 = xercesc_4_0::XMLElementDecl::getFullName((XMLElementDecl *)this_01);
          StrX::StrX(&local_68,pXVar5);
          std::operator<<(poVar3,local_68.fLocalForm);
          std::operator<<(poVar3,"\n");
          StrX::~StrX(&local_68);
          poVar3 = std::operator<<((ostream *)&std::cout,"  Content Model: ");
          pXVar5 = (XMLCh *)(**(code **)(*(long *)this_01 + 0x68))(this_01);
          StrX::StrX(&local_68,pXVar5);
          std::operator<<(poVar3,local_68.fLocalForm);
          std::operator<<(poVar3,"\n");
          StrX::~StrX(&local_68);
          cVar2 = (**(code **)(*(long *)this_01 + 0x38))(this_01);
          if (cVar2 != '\0') {
            std::operator<<((ostream *)&std::cout,"  Attributes:\n");
            plVar6 = (long *)(**(code **)(*(long *)this_01 + 0x28))(this_01);
            uVar10 = 0;
            while( true ) {
              uVar7 = (**(code **)(*plVar6 + 0x50))(plVar6);
              if (uVar7 <= uVar10) break;
              plVar8 = (long *)(**(code **)(*plVar6 + 0x58))(plVar6,(ulong)uVar10);
              poVar3 = std::operator<<((ostream *)&std::cout,"    Name:");
              pXVar5 = (XMLCh *)(**(code **)(*plVar8 + 0x28))(plVar8);
              StrX::StrX(&local_68,pXVar5);
              std::operator<<(poVar3,local_68.fLocalForm);
              std::operator<<(poVar3,", Type: ");
              StrX::~StrX(&local_68);
              if ((ulong)*(uint *)((long)plVar8 + 0xc) < 10) {
                std::operator<<((ostream *)&std::cout,
                                &DAT_0010338c +
                                *(int *)(&DAT_0010338c + (ulong)*(uint *)((long)plVar8 + 0xc) * 4));
              }
              std::operator<<((ostream *)&std::cout,"\n");
              uVar10 = uVar10 + 1;
            }
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"\nErrors occurred, no output available\n");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    (**(code **)(*(long *)this_00 + 8))(this_00);
    xercesc_4_0::XMLPlatformUtils::Terminate();
    iVar9 = (uint)(0 < local_5c) << 2;
  }
  return iVar9;
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C system
    try
    {
         XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr   << "Error during initialization! Message:\n"
                << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    // We only have one required parameter, which is the file to process
    if ((argC != 2) || (*(argV[1]) == '-'))
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    const char*              xmlFile   = argV[1];
    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;

    //
    //  Create a DTD validator to be used for our validation work. Then create
    //  a SAX parser object and pass it our validator. Then, according to what
    //  we were told on the command line, set it to validate or not. He owns
    //  the validator, so we have to allocate it.
    //
    int errorCount = 0;
    DTDValidator* valToUse = new DTDValidator;
    SAXParser* parser = new SAXParser(valToUse);
    parser->setValidationScheme(valScheme);

    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    int errorCode = 0;
    try
    {
        parser->parse(xmlFile);
        errorCount = parser->getErrorCount();
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorCode = 5;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing: '" << xmlFile << "'\n"
             << "Exception message is:  \n"
             << StrX(e.getMessage()) << "\n" << std::endl;
        errorCode = 4;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    if (!errorCount) {
        //
        //  Now we will get an enumerator for the element pool from the validator
        //  and enumerate the elements, printing them as we go. For each element
        //  we get an enumerator for its attributes and print them also.
        //
        DTDGrammar* grammar = (DTDGrammar*) valToUse->getGrammar();
        NameIdPoolEnumerator<DTDElementDecl> elemEnum = grammar->getElemEnumerator();
        if (elemEnum.hasMoreElements())
        {
            std::cout << "\nELEMENTS:\n----------------------------\n";
            while(elemEnum.hasMoreElements())
            {
                const DTDElementDecl& curElem = elemEnum.nextElement();
                std::cout << "  Name: " << StrX(curElem.getFullName()) << "\n";

                std::cout << "  Content Model: "
                     << StrX(curElem.getFormattedContentModel())
                     << "\n";

                // Get an enumerator for this guy's attributes if any
                if (curElem.hasAttDefs())
                {
                    std::cout << "  Attributes:\n";
                    XMLAttDefList& attList = curElem.getAttDefList();
                    for (unsigned int i=0; i<attList.getAttDefCount(); i++)
                    {
                        const XMLAttDef& curAttDef = attList.getAttDef(i);
                        std::cout << "    Name:" << StrX(curAttDef.getFullName())
                             << ", Type: ";

                        // Get the type and display it
                        const XMLAttDef::AttTypes type = curAttDef.getType();
                        switch(type)
                        {
                            case XMLAttDef::CData :
                                std::cout << "CDATA";
                                break;

                            case XMLAttDef::ID :
                                std::cout << "ID";
                                break;

                            case XMLAttDef::IDRef :
                            case XMLAttDef::IDRefs :
                                std::cout << "IDREF(S)";
                                break;

                            case XMLAttDef::Entity :
                            case XMLAttDef::Entities :
                                std::cout << "ENTITY(IES)";
                                break;

                            case XMLAttDef::NmToken :
                            case XMLAttDef::NmTokens :
                                std::cout << "NMTOKEN(S)";
                                break;

                            case XMLAttDef::Notation :
                                std::cout << "NOTATION";
                                break;

                            case XMLAttDef::Enumeration :
                                std::cout << "ENUMERATION";
                                break;
                            default:
                                break;
                        }

                        std::cout << "\n";
                    }
                }
                std::cout << std::endl;
            }
        }
         else
        {
            std::cout << "The validator has no elements to display\n" << std::endl;
        }
    }
    else
        std::cout << "\nErrors occurred, no output available\n" << std::endl;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}